

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O1

void sx__coro_invoke(sx_coro_context *ctx,sx_fiber_cb *callback,void *user)

{
  uint uVar1;
  int iVar2;
  sx_pool *psVar3;
  sx__coro_state *psVar4;
  code *pcVar5;
  _Bool _Var6;
  sx__pool_page *psVar7;
  long lVar8;
  sx__pool_page *psVar9;
  sx_fiber_t pvVar10;
  ulong uVar11;
  sx__pool_page *psVar12;
  uint32_t line;
  
  psVar3 = ctx->coro_pool;
  for (psVar7 = psVar3->pages; (psVar7 != (sx__pool_page *)0x0 && (psVar7->iter < 1));
      psVar7 = psVar7->next) {
  }
  if (psVar7 == (sx__pool_page *)0x0) {
    uVar1 = psVar3->capacity;
    uVar11 = (ulong)uVar1;
    iVar2 = psVar3->item_sz;
    psVar7 = (sx__pool_page *)
             (*ctx->alloc->alloc_cb)
                       ((void *)0x0,((long)iVar2 + 8) * (long)(int)uVar1 + 0x20,0x10,
                        "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                        "void sx__coro_invoke(sx_coro_context *, sx_fiber_cb *, void *)",0xda,
                        ctx->alloc->user_data);
    if (psVar7 == (sx__pool_page *)0x0) {
      sx__mem_run_fail_callback
                ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h",
                 0x3e);
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0x3e,"Out of memory");
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
    psVar7->iter = uVar1;
    psVar7->ptrs = &psVar7[1].ptrs;
    psVar7->buff = (uint8_t *)(&psVar7[1].ptrs + (int)uVar1);
    psVar7->next = (sx__pool_page *)0x0;
    if (0 < (int)uVar1) {
      lVar8 = 0;
      do {
        psVar7->ptrs[uVar11 - 1] = psVar7->buff + lVar8;
        lVar8 = lVar8 + iVar2;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    memset(psVar7->buff,0,(long)(int)(iVar2 * uVar1));
    if (psVar7 != (sx__pool_page *)0x0) {
      psVar12 = psVar3->pages;
      do {
        psVar9 = psVar12;
        psVar12 = psVar9->next;
      } while (psVar12 != (sx__pool_page *)0x0);
      psVar9->next = psVar7;
    }
  }
  psVar7 = ctx->coro_pool->pages;
  do {
    psVar12 = psVar7;
    iVar2 = psVar12->iter;
    if (iVar2 != 0) break;
    psVar7 = psVar12->next;
  } while (psVar12->next != (sx__pool_page *)0x0);
  if (iVar2 < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0x8f,"capacity is full");
    pcVar5 = (code *)swi(3);
    (*pcVar5)();
    return;
  }
  psVar12->iter = iVar2 - 1U;
  psVar4 = (sx__coro_state *)psVar12->ptrs[iVar2 - 1U];
  if (psVar4 != (sx__coro_state *)0x0) {
    if (psVar4->init == false) {
      _Var6 = sx_fiber_stack_init(&psVar4->stack_mem,ctx->stack_sz);
      if (!_Var6) {
        sx__mem_run_fail_callback
                  ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",0xe3)
        ;
        line = 0xe3;
        goto LAB_0010d487;
      }
      psVar4->init = true;
    }
    pvVar10 = (sx_fiber_t)make_fcontext((psVar4->stack_mem).sptr,(psVar4->stack_mem).ssize,callback)
    ;
    psVar4->fiber = pvVar10;
    psVar4->callback = callback;
    psVar4->user = user;
    if (ctx->run_list_last != (sx__coro_state *)0x0) {
      ctx->run_list_last->next = psVar4;
      psVar4->prev = ctx->run_list_last;
    }
    ctx->run_list_last = psVar4;
    if (ctx->run_list == (sx__coro_state *)0x0) {
      ctx->run_list = psVar4;
    }
    ctx->cur_coro = psVar4;
    pvVar10 = (sx_fiber_t)jump_fcontext(psVar4->fiber,user);
    psVar4->fiber = pvVar10;
    return;
  }
  sx__mem_run_fail_callback
            ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",0xdc);
  line = 0xdc;
LAB_0010d487:
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",line
                    ,"Out of memory");
  pcVar5 = (code *)swi(3);
  (*pcVar5)();
  return;
}

Assistant:

void sx__coro_invoke(sx_coro_context* ctx, sx_fiber_cb* callback, void* user)
{
    sx__coro_state* fs = sx_pool_new_and_grow(ctx->coro_pool, ctx->alloc);
    if (!fs) {
        sx_out_of_memory();
        return;
    }

    // Initialize stack memory if not initilized
    if (!fs->init) {
        if (!sx_fiber_stack_init(&fs->stack_mem, ctx->stack_sz)) {
            sx_out_of_memory();
            return;
        }
        fs->init = true;
    }

    fs->fiber = sx_fiber_create(fs->stack_mem, callback);
    fs->callback = callback;
    fs->user = user;
    // Add to the end of the list
    sx__coro_add_list(&ctx->run_list, &ctx->run_list_last, fs);

    ctx->cur_coro = fs;
    fs->fiber = sx_fiber_switch(fs->fiber, user).from;
}